

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ReportOnFunctionSelectError
               (ExpressionContext *ctx,SynBase *source,char *errorBuf,uint errorBufSize,
               char *messageStart,InplaceStr functionName,ArrayView<FunctionValue> functions,
               IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,
               ArrayView<unsigned_int> ratings,uint bestRating,bool showInstanceInfo)

{
  FunctionData *function_00;
  TypeBase *pTVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  ArrayView<ArgumentData> AVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  ArgumentData *pAVar10;
  FunctionValue *pFVar11;
  uint *puVar12;
  MatchData *pMVar13;
  TypeRef *pTVar14;
  TypeFunction *instance_00;
  size_t sVar15;
  char *pcVar16;
  char *pcVar17;
  ArrayView<CallArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<CallArgumentData> arguments_02;
  ArrayView<ArgumentData> functionArguments;
  char *messageEnd;
  MatchData *curr_1;
  ArgumentData *argument_1;
  TypeHandle *pTStack_208;
  uint k_2;
  TypeHandle *curr;
  undefined4 local_1f8;
  undefined1 local_1f0 [12];
  TypeFunction *local_1e0;
  TypeFunction *instance;
  uint uStack_1d0;
  undefined4 uStack_1cc;
  undefined1 local_1b8 [12];
  undefined1 local_1a8 [8];
  SmallArray<CallArgumentData,_16U> result;
  IntrusiveList<MatchData> aliases;
  TypeBase *parentType;
  ArgumentData *argument;
  uint k_1;
  MatchData *match;
  uint k;
  FunctionData *function;
  uint i_1;
  uint i;
  TypeHandle *el;
  char *errPos;
  bool showInstanceInfo_local;
  uint bestRating_local;
  char *messageStart_local;
  uint errorBufSize_local;
  char *errorBuf_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if (errorBuf == (char *)0x0) {
    __assert_fail("errorBuf",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x192e,
                  "void ReportOnFunctionSelectError(ExpressionContext &, SynBase *, char *, unsigned int, const char *, InplaceStr, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, ArrayView<unsigned int>, unsigned int, bool)"
                 );
  }
  bVar6 = InplaceStr::empty(&functionName);
  iVar4 = (int)errorBuf;
  el = (TypeHandle *)errorBuf;
  if (!bVar6) {
    iVar7 = NULLC::SafeSprintf(errorBuf,(ulong)errorBufSize,"  %.*s",
                               (long)functionName.end - (long)functionName.begin,functionName.begin)
    ;
    pcVar9 = errorBuf + iVar7;
    bVar6 = IntrusiveList<TypeHandle>::empty(&generics);
    if (bVar6) {
      iVar7 = NULLC::SafeSprintf(pcVar9,(ulong)(errorBufSize - ((int)pcVar9 - iVar4)),"(");
      el = (TypeHandle *)(pcVar9 + iVar7);
    }
    else {
      iVar7 = NULLC::SafeSprintf(pcVar9,(ulong)(errorBufSize - ((int)pcVar9 - iVar4)),"<");
      el = (TypeHandle *)(pcVar9 + iVar7);
      for (_i_1 = generics.head; _i_1 != (TypeHandle *)0x0; _i_1 = _i_1->next) {
        pcVar9 = "";
        if (_i_1 != generics.head) {
          pcVar9 = ", ";
        }
        iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),"%s%.*s",
                                   pcVar9,(ulong)(uint)((int)(_i_1->type->name).end -
                                                       (int)(_i_1->type->name).begin),
                                   (_i_1->type->name).begin);
        el = (TypeHandle *)((long)&el->type + (long)iVar7);
      }
      iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),">(");
      el = (TypeHandle *)((long)&el->type + (long)iVar7);
    }
    function._4_4_ = 0;
    while( true ) {
      uVar8 = ArrayView<ArgumentData>::size(&arguments);
      if (uVar8 <= function._4_4_) break;
      pcVar9 = "";
      if (function._4_4_ != 0) {
        pcVar9 = ", ";
      }
      pAVar10 = ArrayView<ArgumentData>::operator[](&arguments,function._4_4_);
      pcVar16 = (pAVar10->type->name).end;
      pAVar10 = ArrayView<ArgumentData>::operator[](&arguments,function._4_4_);
      pcVar17 = (pAVar10->type->name).begin;
      pAVar10 = ArrayView<ArgumentData>::operator[](&arguments,function._4_4_);
      iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),"%s%.*s",
                                 pcVar9,(ulong)(uint)((int)pcVar16 - (int)pcVar17),
                                 (pAVar10->type->name).begin);
      el = (TypeHandle *)((long)&el->type + (long)iVar7);
      function._4_4_ = function._4_4_ + 1;
    }
    bVar6 = ArrayView<FunctionValue>::empty(&functions);
    pcVar9 = ")";
    if (((bVar6 ^ 0xffU) & 1) != 0) {
      pcVar9 = ")\n";
    }
    iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),pcVar9);
    el = (TypeHandle *)((long)&el->type + (long)iVar7);
  }
  bVar6 = ArrayView<FunctionValue>::empty(&functions);
  if (!bVar6) {
    pcVar9 = " candidates are:\n";
    if (bestRating == 0xffffffff) {
      pcVar9 = " the only available are:\n";
    }
    iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),pcVar9);
    el = (TypeHandle *)((long)&el->type + (long)iVar7);
  }
  function._0_4_ = 0;
  do {
    uVar8 = ArrayView<FunctionValue>::size(&functions);
    if (uVar8 <= (uint)function) {
      sVar15 = strlen(ctx->errorBufLocation);
      ctx->errorBufLocation = ctx->errorBufLocation + sVar15;
      anon_unknown.dwarf_8df1c::AddErrorInfoWithLocation
                (ctx,source,messageStart,ctx->errorBufLocation);
      return;
    }
    pFVar11 = ArrayView<FunctionValue>::operator[](&functions,(uint)function);
    function_00 = pFVar11->function;
    bVar6 = ArrayView<unsigned_int>::empty(&ratings);
    if ((bVar6) ||
       (puVar12 = ArrayView<unsigned_int>::operator[](&ratings,(uint)function),
       *puVar12 == bestRating)) {
      iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),"  %.*s %.*s",
                                 (ulong)(uint)((int)(function_00->type->returnType->name).end -
                                              (int)(function_00->type->returnType->name).begin),
                                 (function_00->type->returnType->name).begin,
                                 (ulong)(uint)((int)(function_00->name->name).end -
                                              (int)(function_00->name->name).begin),
                                 (function_00->name->name).begin);
      el = (TypeHandle *)((long)&el->type + (long)iVar7);
      bVar6 = IntrusiveList<MatchData>::empty(&function_00->generics);
      if (!bVar6) {
        iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),"<");
        el = (TypeHandle *)((long)&el->type + (long)iVar7);
        match._4_4_ = 0;
        while( true ) {
          uVar8 = IntrusiveList<MatchData>::size(&function_00->generics);
          if (uVar8 <= match._4_4_) break;
          pMVar13 = IntrusiveList<MatchData>::operator[](&function_00->generics,match._4_4_);
          pcVar9 = "";
          if (match._4_4_ != 0) {
            pcVar9 = ", ";
          }
          iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),"%s%.*s",
                                     pcVar9,(ulong)(uint)((int)(pMVar13->type->name).end -
                                                         (int)(pMVar13->type->name).begin),
                                     (pMVar13->type->name).begin);
          el = (TypeHandle *)((long)&el->type + (long)iVar7);
          match._4_4_ = match._4_4_ + 1;
        }
        iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),">");
        el = (TypeHandle *)((long)&el->type + (long)iVar7);
      }
      iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),"(");
      el = (TypeHandle *)((long)&el->type + (long)iVar7);
      argument._4_4_ = 0;
      while( true ) {
        uVar8 = SmallArray<ArgumentData,_4U>::size(&function_00->arguments);
        iVar7 = (int)el;
        if (uVar8 <= argument._4_4_) break;
        pAVar10 = SmallArray<ArgumentData,_4U>::operator[](&function_00->arguments,argument._4_4_);
        pcVar9 = "";
        if (argument._4_4_ != 0) {
          pcVar9 = ", ";
        }
        pcVar16 = "";
        if ((pAVar10->isExplicit & 1U) != 0) {
          pcVar16 = "explicit ";
        }
        iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - (iVar7 - iVar4)),"%s%s%.*s",
                                   pcVar9,pcVar16,
                                   (ulong)(uint)((int)(pAVar10->type->name).end -
                                                (int)(pAVar10->type->name).begin),
                                   (pAVar10->type->name).begin);
        el = (TypeHandle *)((long)&el->type + (long)iVar7);
        argument._4_4_ = argument._4_4_ + 1;
      }
      bVar6 = ExpressionContext::IsGenericFunction(ctx,function_00);
      if ((bVar6) && (showInstanceInfo)) {
        aliases.tail = (MatchData *)0x0;
        pFVar11 = ArrayView<FunctionValue>::operator[](&functions,(uint)function);
        if ((TypeStruct *)pFVar11->context->type == ctx->typeAutoRef) {
          if (function_00->scope->ownerType == (TypeBase *)0x0) {
            __assert_fail("function->scope->ownerType",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1975,
                          "void ReportOnFunctionSelectError(ExpressionContext &, SynBase *, char *, unsigned int, const char *, InplaceStr, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, ArrayView<unsigned int>, unsigned int, bool)"
                         );
          }
          aliases.tail = (MatchData *)function_00->scope->ownerType;
        }
        else if (function_00->scope->ownerType != (TypeBase *)0x0) {
          pFVar11 = ArrayView<FunctionValue>::operator[](&functions,(uint)function);
          pTVar14 = getType<TypeRef>(pFVar11->context->type);
          aliases.tail = (MatchData *)pTVar14->subType;
        }
        IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&result.allocator);
        SmallArray<CallArgumentData,_16U>::SmallArray
                  ((SmallArray<CallArgumentData,_16U> *)local_1a8,ctx->allocator);
        ArrayView<ArgumentData>::ArrayView<4u>
                  ((ArrayView<ArgumentData> *)local_1b8,&function_00->arguments);
        AVar5 = arguments;
        instance = (TypeFunction *)arguments.data;
        uStack_1d0 = arguments.count;
        uStack_1cc = arguments._12_4_;
        arguments_01._12_4_ = 0;
        arguments_01.data = arguments.data;
        arguments_01.count = arguments.count;
        functionArguments._12_4_ = 0;
        functionArguments.data = (ArgumentData *)local_1b8._0_8_;
        functionArguments.count = local_1b8._8_4_;
        arguments = AVar5;
        bVar6 = PrepareArgumentsForFunctionCall
                          (ctx,source,functionArguments,arguments_01,
                           (SmallArray<CallArgumentData,_16U> *)local_1a8,(uint *)0x0,false);
        if ((bVar6) &&
           ((pFVar11 = ArrayView<FunctionValue>::operator[](&functions,(uint)function),
            (TypeStruct *)pFVar11->context->type != ctx->typeAutoRef ||
            (bVar6 = IntrusiveList<TypeHandle>::empty(&generics), bVar6)))) {
          ArrayView<CallArgumentData>::ArrayView<16u>
                    ((ArrayView<CallArgumentData> *)local_1f0,
                     (SmallArray<CallArgumentData,_16U> *)local_1a8);
          arguments_02._12_4_ = 0;
          arguments_02.data = (CallArgumentData *)local_1f0._0_8_;
          arguments_02.count = local_1f0._8_4_;
          instance_00 = GetGenericFunctionInstanceType
                                  (ctx,source,(TypeBase *)aliases.tail,function_00,arguments_02,
                                   (IntrusiveList<MatchData> *)&result.allocator);
          local_1e0 = instance_00;
          if (instance_00 == (TypeFunction *)0x0) {
            iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize + (iVar4 - iVar7)),
                                       ") (wasn\'t instanced here)");
            el = (TypeHandle *)((long)&el->type + (long)iVar7);
          }
          else {
            ArrayView<CallArgumentData>::ArrayView<16u>
                      ((ArrayView<CallArgumentData> *)&curr,
                       (SmallArray<CallArgumentData,_16U> *)local_1a8);
            arguments_00._12_4_ = 0;
            arguments_00.data = (CallArgumentData *)curr;
            arguments_00.count = local_1f8;
            GetFunctionRating(ctx,function_00,instance_00,arguments_00);
            pTVar1 = function_00->type->returnType;
            pcVar9 = (pTVar1->name).begin;
            pcVar16 = (function_00->name->name).begin;
            iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize + (iVar4 - iVar7)),
                                       ") instanced to\n    %.*s %.*s(",
                                       (ulong)(uint)(*(int *)&(pTVar1->name).end - (int)pcVar9),
                                       pcVar9,(ulong)(uint)(*(int *)&(function_00->name->name).end -
                                                           (int)pcVar16),pcVar16);
            el = (TypeHandle *)((long)&el->type + (long)iVar7);
            pTStack_208 = (local_1e0->arguments).head;
            argument_1._4_4_ = 0;
            while( true ) {
              uVar8 = SmallArray<ArgumentData,_4U>::size(&function_00->arguments);
              iVar7 = (int)el;
              if (uVar8 <= argument_1._4_4_) break;
              pAVar10 = SmallArray<ArgumentData,_4U>::operator[]
                                  (&function_00->arguments,argument_1._4_4_);
              pcVar17 = "";
              pcVar9 = "";
              if (argument_1._4_4_ != 0) {
                pcVar9 = ", ";
              }
              if ((pAVar10->isExplicit & 1U) != 0) {
                pcVar17 = "explicit ";
              }
              pcVar16 = (pTStack_208->type->name).begin;
              iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize + (iVar4 - iVar7)),
                                         "%s%s%.*s",pcVar9,pcVar17,
                                         (ulong)(uint)(*(int *)&(pTStack_208->type->name).end -
                                                      (int)pcVar16),pcVar16);
              el = (TypeHandle *)((long)&el->type + (long)iVar7);
              pTStack_208 = pTStack_208->next;
              argument_1._4_4_ = argument_1._4_4_ + 1;
            }
            bVar6 = IntrusiveList<MatchData>::empty((IntrusiveList<MatchData> *)&result.allocator);
            if (bVar6) {
              iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize + (iVar4 - iVar7)),")");
              el = (TypeHandle *)((long)&el->type + (long)iVar7);
            }
            else {
              iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize + (iVar4 - iVar7)),
                                         ") with [");
              el = (TypeHandle *)((long)&el->type + (long)iVar7);
              for (messageEnd = (char *)result.allocator; messageEnd != (char *)0x0;
                  messageEnd = *(char **)(messageEnd + 0x10)) {
                pcVar9 = "";
                if ((Allocator *)messageEnd != result.allocator) {
                  pcVar9 = ", ";
                }
                uVar2 = *(undefined8 *)(*(long *)messageEnd + 0x40);
                uVar3 = *(undefined8 *)(*(long *)(messageEnd + 8) + 0x10);
                pcVar16 = (char *)CONCAT44((int)((ulong)pcVar16 >> 0x20),
                                           *(int *)(*(long *)(messageEnd + 8) + 0x18) - (int)uVar3);
                iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize + (iVar4 - (int)el)),
                                           "%s%.*s = %.*s",pcVar9,
                                           (ulong)(uint)(*(int *)(*(long *)messageEnd + 0x48) -
                                                        (int)uVar2),uVar2,pcVar16,uVar3);
                el = (TypeHandle *)((long)&el->type + (long)iVar7);
              }
              iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize + (iVar4 - (int)el)),"]");
              el = (TypeHandle *)((long)&el->type + (long)iVar7);
            }
          }
        }
        else {
          iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize + (iVar4 - iVar7)),
                                     ") (wasn\'t instanced here)");
          el = (TypeHandle *)((long)&el->type + (long)iVar7);
        }
        SmallArray<CallArgumentData,_16U>::~SmallArray
                  ((SmallArray<CallArgumentData,_16U> *)local_1a8);
      }
      else {
        iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - (iVar7 - iVar4)),")");
        el = (TypeHandle *)((long)&el->type + (long)iVar7);
      }
      iVar7 = NULLC::SafeSprintf((char *)el,(ulong)(errorBufSize - ((int)el - iVar4)),"\n");
      el = (TypeHandle *)((long)&el->type + (long)iVar7);
    }
    function._0_4_ = (uint)function + 1;
  } while( true );
}

Assistant:

void ReportOnFunctionSelectError(ExpressionContext &ctx, SynBase *source, char* errorBuf, unsigned errorBufSize, const char *messageStart, InplaceStr functionName, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, ArrayView<unsigned> ratings, unsigned bestRating, bool showInstanceInfo)
{
	assert(errorBuf);

	char *errPos = errorBuf;

	if(!functionName.empty())
	{
		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "  %.*s", FMT_ISTR(functionName));

		if(!generics.empty())
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "<");

			for(TypeHandle *el = generics.head; el; el = el->next)
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", el != generics.head ? ", " : "", FMT_ISTR(el->type->name));
			}

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ">(");
		}
		else
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "(");
		}

		for(unsigned i = 0; i < arguments.size(); i++)
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), !functions.empty() ? ")\n" : ")");
	}

	if(!functions.empty())
		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), bestRating == ~0u ? " the only available are:\n" : " candidates are:\n");

	for(unsigned i = 0; i < functions.size(); i++)
	{
		FunctionData *function = functions[i].function;

		if(!ratings.empty() && ratings[i] != bestRating)
			continue;

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "  %.*s %.*s", FMT_ISTR(function->type->returnType->name), FMT_ISTR(function->name->name));

		if(!function->generics.empty())
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "<");

			for(unsigned k = 0; k < function->generics.size(); k++)
			{
				MatchData *match = function->generics[k];

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", k != 0 ? ", " : "", FMT_ISTR(match->type->name));
			}

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ">");
		}

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "(");

		for(unsigned k = 0; k < function->arguments.size(); k++)
		{
			ArgumentData &argument = function->arguments[k];

			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%s%.*s", k != 0 ? ", " : "", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name));
		}

		if(ctx.IsGenericFunction(function) && showInstanceInfo)
		{
			TypeBase *parentType = NULL;

			if(functions[i].context->type == ctx.typeAutoRef)
			{
				assert(function->scope->ownerType);
				parentType = function->scope->ownerType;
			}
			else if(function->scope->ownerType)
			{
				parentType = getType<TypeRef>(functions[i].context->type)->subType;
			}

			IntrusiveList<MatchData> aliases;
			SmallArray<CallArgumentData, 16> result(ctx.allocator);

			// Handle named argument order, default argument values and variadic functions
			if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, false) || (functions[i].context->type == ctx.typeAutoRef && !generics.empty()))
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") (wasn't instanced here)");
			}
			else if(TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases))
			{
				GetFunctionRating(ctx, function, instance, result);

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") instanced to\n    %.*s %.*s(", FMT_ISTR(function->type->returnType->name), FMT_ISTR(function->name->name));

				TypeHandle *curr = instance->arguments.head;

				for(unsigned k = 0; k < function->arguments.size(); k++)
				{
					ArgumentData &argument = function->arguments[k];

					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%s%.*s", k != 0 ? ", " : "", argument.isExplicit ? "explicit " : "", FMT_ISTR(curr->type->name));

					curr = curr->next;
				}

				if(!aliases.empty())
				{
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") with [");

					for(MatchData *curr = aliases.head; curr; curr = curr->next)
						errPos += NULLC::SafeSprintf(errPos, errorBufSize - unsigned(errPos - errorBuf), "%s%.*s = %.*s", curr != aliases.head ? ", " : "", FMT_ISTR(curr->name->name), FMT_ISTR(curr->type->name));

					errPos += NULLC::SafeSprintf(errPos, errorBufSize - unsigned(errPos - errorBuf), "]");
				}
				else
				{
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");
				}
			}
			else
			{
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ") (wasn't instanced here)");
			}
		}
		else
		{
			errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");
		}

		errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\n");
	}

	ctx.errorBufLocation += strlen(ctx.errorBufLocation);

	const char *messageEnd = ctx.errorBufLocation;

	AddErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
}